

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyn_tbl.cpp
# Opt level: O3

void dyn_tbl_print(dyn_tbl_t *dyn_tbl,char *output)

{
  uint uVar1;
  uint uVar2;
  _Hash_node_base *p_Var3;
  FILE *__stream;
  char addr1 [30];
  char addr2 [30];
  char acStack_78 [32];
  char local_58 [40];
  
  __stream = fopen(output,"w");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"length: %u\n",(ulong)(uint)(dyn_tbl->array)._M_h._M_element_count);
    for (p_Var3 = (dyn_tbl->array)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
        p_Var3 = p_Var3->_M_nxt) {
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      if (dyn_tbl->lgn == 0x20) {
        sprintf(acStack_78,"%d.%d.%d.%d",(ulong)(uVar1 & 0xff),(ulong)(uVar1 >> 8 & 0xff),
                (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 0x18));
        fprintf(__stream,"%s %lld\n",acStack_78,p_Var3[3]._M_nxt);
      }
      else {
        uVar2 = *(uint *)((long)&p_Var3[1]._M_nxt + 4);
        sprintf(acStack_78,"%d.%d.%d.%d",(ulong)(uVar1 & 0xff),(ulong)(uVar1 >> 8 & 0xff),
                (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 0x18));
        sprintf(local_58,"%d.%d.%d.%d",(ulong)(uVar2 & 0xff),(ulong)(uVar2 >> 8 & 0xff),
                (ulong)(uVar2 >> 0x10 & 0xff),(ulong)(uVar2 >> 0x18));
        fprintf(__stream,"%s %s %lld\n",acStack_78,local_58,p_Var3[3]._M_nxt);
      }
    }
    fclose(__stream);
    return;
  }
  dyn_tbl_print();
  return;
}

Assistant:

void dyn_tbl_print(dyn_tbl_t* dyn_tbl, const char* output) {
	FILE* fp;

	// open a file
	if ((fp = fopen(output, "w")) == NULL) {
		fprintf(stderr, "ERR: cannot open %s\n", output);
		exit(-1);
	}

	unsigned int len = dyn_tbl->array.size();
	fprintf(fp, "length: %u\n", len);
	// for(std::unordered_map<dyn_tbl_key_t, long long>::iterator it = dyn_tbl->array.begin(); it != dyn_tbl->array.end(); ++it) {
	for (auto it = dyn_tbl->array.begin(); it != dyn_tbl->array.end(); ++it) {
		dyn_tbl_key_t key = it->first;
		if (dyn_tbl->lgn == 32) {
			char addr1[30];
			unsigned int* ptr = (unsigned int*)key.key;
			fprintf(fp, "%s %lld\n", ip2a(*ptr, addr1), it->second);
		}
		else {
			char addr1[30];
			char addr2[30];
			unsigned int* ptr = (unsigned int*)key.key;
			fprintf(fp, "%s %s %lld\n", ip2a(*ptr, addr1), ip2a(*(ptr + 1), addr2), it->second);
		}
	}

	// close the file
	fclose(fp);
}